

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNamePrinter.h
# Opt level: O1

void __thiscall psy::C::SyntaxNamePrinter::~SyntaxNamePrinter(SyntaxNamePrinter *this)

{
  pointer ptVar1;
  
  ptVar1 = (this->dump_).
           super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptVar1 != (pointer)0x0) {
    operator_delete(ptVar1,(long)(this->dump_).
                                 super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar1);
  }
  SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class PSY_C_API SyntaxNamePrinter final : public SyntaxDumper
{
public:
    using SyntaxDumper::SyntaxDumper;

    enum class Style : char
    {
        Plain,
        Decorated
    };

    void print(const SyntaxNode* node, Style style);
    void print(const SyntaxNode* node, Style style, std::ostream& os);

private:
    virtual void nonterminal(const SyntaxNode* node) override;

    std::vector<std::tuple<const SyntaxNode*, int>> dump_;
}